

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void SstFFSMarshalAttribute
               (SstStream Stream,char *Name,int Type,size_t ElemSize,size_t ElemCount,void *Data)

{
  long lVar1;
  char *Name_00;
  size_t in_RCX;
  int in_EDX;
  long in_RDI;
  long in_R8;
  SstStream in_R9;
  int DataOffset;
  char *SstName;
  char *DataAddress;
  char *AttrString;
  FFSWriterMarshalBase *Info;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  SstStream CountP;
  SstStream Stream_00;
  size_t local_20;
  
  lVar1 = *(long *)(in_RDI + 0x1c0);
  CountP = in_R9;
  Stream_00 = (SstStream)0x0;
  local_20 = in_RCX;
  if (in_EDX == 0xe) {
    local_20 = 8;
    CountP = (SstStream)&stack0xffffffffffffffc0;
    Stream_00 = in_R9;
  }
  if (in_R8 == -1) {
    Name_00 = BuildVarName((char *)Stream_00,(int)((ulong)CountP >> 0x20),(int)CountP);
    AddField((FMFieldList *)Stream_00,(int *)CountP,Name_00,in_stack_ffffffffffffffac,
             in_stack_ffffffffffffffa8);
    free(Name_00);
    RecalcAttributeStorageSize(Stream_00);
    memcpy((void *)(*(long *)(lVar1 + 0x60) +
                   (long)*(int *)(*(long *)(lVar1 + 0x50) +
                                  (long)(*(int *)(lVar1 + 0x48) + -1) * 0x18 + 0x14)),CountP,
           local_20);
  }
  return;
}

Assistant:

extern void SstFFSMarshalAttribute(SstStream Stream, const char *Name, const int Type,
                                   size_t ElemSize, size_t ElemCount, const void *Data)
{

    struct FFSWriterMarshalBase *Info;
    Info = (struct FFSWriterMarshalBase *)Stream->WriterMarshalData;
    const char *AttrString = NULL;
    const char *DataAddress = Data;

    if (Type == String)
    {
        ElemSize = sizeof(char *);
        AttrString = Data;
        DataAddress = (const char *)&AttrString;
    }
    if (ElemCount == (size_t)(-1))
    {
        // simple field, only simple attribute name and value
        char *SstName = BuildVarName(Name, Type, (int)ElemSize);
        AddField(&Info->AttributeFields, &Info->AttributeFieldCount, SstName, Type, (int)ElemSize);
        free(SstName);
        RecalcAttributeStorageSize(Stream);
        int DataOffset = Info->AttributeFields[Info->AttributeFieldCount - 1].field_offset;
        memcpy((char *)(Info->AttributeData) + DataOffset, DataAddress, ElemSize);
    }
    else
    {
        /* // Array field.  To Metadata, add FMFields for DimCount, Shape, Count
         */
        /* // and Offsets matching _MetaArrayRec */
        /* char *ArrayName = BuildStaticArrayName(Name, Type, ElemCount); */
        /* AddField(&Info->AttributeFields, &Info->AttributeFieldCount,
         * ArrayName, Type, */
        /*          sizeof(size_t)); */
        /* free(ArrayName); */
        /* Rec->MetaOffset = */
        /*     Info->MetaFields[Info->MetaFieldCount - 1].field_offset; */
        /* char *ShapeName = ConcatName(Name, "Shape"); */
        /* char *CountName = ConcatName(Name, "Count"); */
        /* char *OffsetsName = ConcatName(Name, "Offsets"); */
        /* AddFixedArrayField(&Info->MetaFields, &Info->MetaFieldCount,
         * ShapeName, */
        /*                    "integer", sizeof(size_t), DimCount); */
        /* AddFixedArrayField(&Info->MetaFields, &Info->MetaFieldCount,
         * CountName, */
        /*                    "integer", sizeof(size_t), DimCount); */
        /* AddFixedArrayField(&Info->MetaFields, &Info->MetaFieldCount, */
        /*                    OffsetsName, "integer", sizeof(size_t), DimCount);
         */
        /* free(ShapeName); */
        /* free(CountName); */
        /* free(OffsetsName); */
        /* RecalcMarshalStorageSize(Stream); */

        /* if ((Stream->ConfigParams->CompressionMethod == SstCompressZFP) && */
        /*     ZFPcompressionPossible(Type, DimCount)) */
        /* { */
        /*     Type = "char"; */
        /*     ElemSize = 1; */
        /* } */
        /* // To Data, add FMFields for ElemCount and Array matching _ArrayRec
         */
        /* char *ElemCountName = ConcatName(Name, "ElemCount"); */
        /* AddField(&Info->DataFields, &Info->DataFieldCount, ElemCountName, */
        /*          "integer", sizeof(size_t)); */
        /* Rec->DataOffset = */
        /*     Info->DataFields[Info->DataFieldCount - 1].field_offset; */
        /* char *SstName = ConcatName(Name, ""); */
        /* AddVarArrayField(&Info->DataFields, &Info->DataFieldCount, SstName,
         */
        /*                  Type, ElemSize, ElemCountName); */
        /* free(SstName); */
        /* free(ElemCountName); */
        /* RecalcMarshalStorageSize(Stream); */
        /* // Changing the formats renders these invalid */
        /* Info->MetaFormat = NULL; */
        /* Info->DataFormat = NULL; */
    }
}